

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  RunContext *this_00;
  IResultCapture *in_RDI;
  TestRunInfo *_runInfo;
  TestRunStats *this_01;
  undefined1 local_60 [96];
  
  this_00 = (RunContext *)
            Detail::unique_ptr<Catch::IEventListener>::operator->
                      ((unique_ptr<Catch::IEventListener> *)(in_RDI + 0x21));
  _runInfo = (TestRunInfo *)(in_RDI + 1);
  this_01 = (TestRunStats *)(in_RDI + 0x19);
  aborting(this_00);
  TestRunStats::TestRunStats(this_01,_runInfo,(Totals *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
  (*(this_00->super_IResultCapture)._vptr_IResultCapture[0x11])(this_00,local_60);
  FatalConditionHandler::~FatalConditionHandler((FatalConditionHandler *)this_00);
  TestCaseTracking::TrackerContext::~TrackerContext((TrackerContext *)0x18ebbd);
  std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::~vector((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
             *)this_01);
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)this_01);
  std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::~vector
            ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)this_01);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)this_01);
  Detail::unique_ptr<Catch::IEventListener>::~unique_ptr
            ((unique_ptr<Catch::IEventListener> *)this_00);
  Optional<Catch::AssertionResult>::~Optional((Optional<Catch::AssertionResult> *)0x18ec1a);
  IResultCapture::~IResultCapture(in_RDI);
  return;
}

Assistant:

RunContext::~RunContext() {
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, aborting()));
    }